

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

void cfl_store_tx(MACROBLOCKD *xd,int row,int col,TX_SIZE tx_size,BLOCK_SIZE bsize)

{
  int input_stride;
  int iVar1;
  int iVar2;
  
  input_stride = xd->plane[0].dst.stride;
  iVar1 = col;
  iVar2 = row;
  if (((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0) ||
     ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0)) {
    if ((xd->mi_row & 1) != 0) {
      iVar2 = (row + 1) - (uint)((xd->cfl).subsampling_y == 0);
    }
    if ((xd->mi_col & 1U) != 0) {
      iVar1 = (col + 1) - (uint)((xd->cfl).subsampling_x == 0);
    }
  }
  cfl_store(&xd->cfl,xd->plane[0].dst.buf + (row * input_stride + col) * 4,input_stride,iVar2,iVar1,
            tx_size,(uint)xd->cur_buf->flags >> 3 & 1);
  return;
}

Assistant:

void cfl_store_tx(MACROBLOCKD *const xd, int row, int col, TX_SIZE tx_size,
                  BLOCK_SIZE bsize) {
  CFL_CTX *const cfl = &xd->cfl;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  uint8_t *dst = &pd->dst.buf[(row * pd->dst.stride + col) << MI_SIZE_LOG2];

  if (block_size_high[bsize] == 4 || block_size_wide[bsize] == 4) {
    // Only dimensions of size 4 can have an odd offset.
    assert(!((col & 1) && tx_size_wide[tx_size] != 4));
    assert(!((row & 1) && tx_size_high[tx_size] != 4));
    sub8x8_adjust_offset(cfl, xd->mi_row, xd->mi_col, &row, &col);
  }
  cfl_store(cfl, dst, pd->dst.stride, row, col, tx_size, is_cur_buf_hbd(xd));
}